

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

xmlAttrPtr get_api_attr(void)

{
  char local_28 [8];
  xmlChar name [20];
  
  if ((api_root == (xmlNodePtr)0x0) || (api_root->type != XML_ELEMENT_NODE)) {
    get_api_root();
  }
  if (api_root == (xmlNodePtr)0x0) {
    stack0xfffffffffffffff0 = (_xmlAttr *)0x0;
  }
  else if (api_root->properties == (_xmlAttr *)0x0) {
    api_attr = (xmlAttrPtr)0x0;
    get_api_attr::nr = get_api_attr::nr + 1;
    snprintf(local_28,0x14,"foo%d");
    api_attr = (xmlAttrPtr)xmlSetProp(api_root,local_28,"bar");
    unique0x100000a0 = api_attr;
  }
  else {
    api_attr = api_root->properties;
    unique0x00012000 = api_root->properties;
  }
  return stack0xfffffffffffffff0;
}

Assistant:

static xmlAttrPtr
get_api_attr(void) {
#if defined(LIBXML_TREE_ENABLED) || defined(LIBXML_XINCLUDE_ENABLED) || defined(LIBXML_SCHEMAS_ENABLED) || defined(LIBXML_HTML_ENABLED)
    static int nr = 0;
    xmlChar name[20];
#endif

    if ((api_root == NULL) || (api_root->type != XML_ELEMENT_NODE)) {
        get_api_root();
    }
    if (api_root == NULL)
        return(NULL);
    if (api_root->properties != NULL) {
        api_attr = api_root->properties;
        return(api_root->properties);
    }
    api_attr = NULL;
#if defined(LIBXML_TREE_ENABLED) || defined(LIBXML_XINCLUDE_ENABLED) || defined(LIBXML_SCHEMAS_ENABLED) || defined(LIBXML_HTML_ENABLED)
    snprintf((char *) name, 20, "foo%d", nr++);
    api_attr = xmlSetProp(api_root, name, (const xmlChar *) "bar");
#endif
    return(api_attr);
}